

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O2

void branch_report(ReportWriter *writer,RomAccessor *rom,Trace *op_trace,
                  AnnotationResolver *annotations)

{
  _Rb_tree_color p;
  byte bVar1;
  Pointer PVar2;
  Pointer resolve_adress;
  int iVar3;
  ulong uVar4;
  Annotation *target_annotation;
  Annotation *source_annotation;
  Annotation *local_1078;
  Pointer local_106c;
  RomAccessor *local_1068;
  Annotation *local_1060;
  _Base_ptr local_1058;
  _Base_ptr local_1050;
  ReportWriter *local_1048;
  ulong local_1040;
  StringBuilder local_1034;
  
  local_1068 = rom;
  memset(&local_1034,0,0x1000);
  ReportWriter::writeSeperator(writer,"Branch analysis");
  ReportWriter::writeComment
            (writer,
             "NOTE: Branches between two functions could mean that they really are one function.");
  ReportWriter::writeComment
            (writer,
             "      Branches out from a function could mean that the function is larger than tagged."
            );
  ReportWriter::writeComment
            (writer,"      This report was generated AFTER extra branches were predicted.");
  local_1048 = writer;
  ReportWriter::writeComment(writer,"");
  local_1034._length = 0;
  local_1034._backing[0] = '\0';
  local_1050 = (op_trace->ops)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1058 = &(op_trace->ops)._M_t._M_impl.super__Rb_tree_header._M_header;
  while( true ) {
    if (local_1050 == local_1058) {
      return;
    }
    p = local_1050[1]._M_color;
    bVar1 = snestistics::RomAccessor::evalByte(local_1068,p);
    if ((&snestistics::branches)[bVar1] == '\x01') break;
LAB_001357eb:
    local_1050 = (_Base_ptr)std::_Rb_tree_increment(local_1050);
  }
  uVar4 = (ulong)(p + 2);
  local_106c = p + _S_black;
  iVar3 = 0;
  local_1040 = uVar4;
  do {
    resolve_adress = (Pointer)uVar4;
    if (iVar3 == 0) {
      bVar1 = snestistics::RomAccessor::evalByte(local_1068,local_106c);
      PVar2 = resolve_adress + bVar1;
      resolve_adress = (resolve_adress - 0x100) + (uint)bVar1;
      if (-1 < (char)bVar1) {
        resolve_adress = PVar2;
      }
    }
    else if (iVar3 == 2) goto LAB_001357eb;
    local_1060 = (Annotation *)0x0;
    local_1078 = (Annotation *)0x0;
    snestistics::AnnotationResolver::resolve_annotation
              (annotations,p,&local_1060,(Annotation **)0x0);
    snestistics::AnnotationResolver::resolve_annotation
              (annotations,resolve_adress,&local_1078,(Annotation **)0x0);
    if ((local_1060 != (Annotation *)0x0) && (local_1060 != local_1078)) {
      local_1034._length = 0;
      local_1034._backing[0] = '\0';
      snestistics::StringBuilder::format
                (&local_1034,"Branch going from %s",(local_1060->name)._M_dataplus._M_p);
      if (local_1078 != (Annotation *)0x0) {
        snestistics::StringBuilder::format(&local_1034," to %s",(local_1078->name)._M_dataplus._M_p)
        ;
      }
      snestistics::StringBuilder::format(&local_1034," [%06X->%06X]",(ulong)p);
      ReportWriter::writeComment(local_1048,&local_1034);
      uVar4 = local_1040;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void branch_report(ReportWriter &writer, const RomAccessor &rom, const Trace &op_trace, const AnnotationResolver &annotations) {
	StringBuilder sb;
	writer.writeSeperator("Branch analysis");
	writer.writeComment("NOTE: Branches between two functions could mean that they really are one function.");
	writer.writeComment("      Branches out from a function could mean that the function is larger than tagged.");
	writer.writeComment("      This report was generated AFTER extra branches were predicted.");
	writer.writeComment("");

	sb.clear();

	for (const auto &it : op_trace.ops) {
		const Pointer pc = it.first;
		uint8_t opcode = rom.evalByte(pc);
		if (!branches[opcode])
			continue;

		for (int myloop = 0; myloop < 2; myloop++) {
			Pointer target = myloop == 0 ? branch8(pc, rom.evalByte(pc+1)) : pc + 2;
			if (myloop == 1 && opcode == 0x80)
				break;

			const Annotation *source_annotation = nullptr, *target_annotation = nullptr;
			annotations.resolve_annotation(pc,     &source_annotation);
			annotations.resolve_annotation(target, &target_annotation);

			if (!source_annotation || source_annotation == target_annotation)
				continue;

			sb.clear();
			sb.format("Branch going from %s", source_annotation->name.c_str());
						
			if (target_annotation) {
				sb.format(" to %s", target_annotation->name.c_str());
			}
			sb.format(" [%06X->%06X]", pc, target);
			writer.writeComment(sb);
		}
	}
}